

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sender3F1S.cpp
# Opt level: O3

void * flow_thread(void *thread_args)

{
  SenderFlow *this;
  int iVar1;
  FILE *__stream;
  void *__ptr;
  void *__buf;
  long lVar2;
  ulong uVar3;
  undefined8 extraout_RAX;
  FILE *__n;
  uint uVar4;
  int in_R8D;
  undefined1 auVar5 [16];
  double dVar6;
  string filename;
  string local_78;
  undefined8 local_58;
  long *local_50 [2];
  long local_40 [2];
  
  this = *thread_args;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,*(long *)((long)thread_args + 8),
             *(long *)((long)thread_args + 0x10) + *(long *)((long)thread_args + 8));
  uVar3 = *(ulong *)((long)thread_args + 0x28);
  __stream = fopen((char *)local_50[0],"r");
  if (__stream == (FILE *)0x0) {
    flow_thread();
    return (void *)0x0;
  }
  __ptr = operator_new__(uVar3);
  local_58 = zmq_stopwatch_start();
  iVar1 = feof(__stream);
  uVar4 = 0;
  if (iVar1 == 0) {
    uVar4 = 0;
    do {
      __n = __stream;
      __buf = (void *)fread(__ptr,1,uVar3,__stream);
      SenderFlow::send(this,(int)__ptr,__buf,(size_t)__n,in_R8D);
      uVar4 = uVar4 + 1;
      iVar1 = feof(__stream);
    } while (iVar1 == 0);
  }
  operator_delete__(__ptr);
  lVar2 = zmq_stopwatch_stop(local_58);
  lVar2 = lVar2 + (ulong)(lVar2 == 0);
  SenderFlow::name_abi_cxx11_(&local_78,this);
  printf("%s. message size: %d [B]\n",local_78._M_dataplus._M_p,uVar3 & 0xffffffff);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  SenderFlow::name_abi_cxx11_(&local_78,this);
  printf("%s. message count: %d\n",local_78._M_dataplus._M_p,(ulong)uVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  SenderFlow::name_abi_cxx11_(&local_78,this);
  auVar5._8_4_ = (int)((ulong)lVar2 >> 0x20);
  auVar5._0_8_ = lVar2;
  auVar5._12_4_ = 0x45300000;
  dVar6 = ((double)(int)uVar4 /
          ((auVar5._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)lVar2) - 4503599627370496.0))) * 1000000.0;
  uVar3 = (ulong)dVar6;
  printf("%s. mean throughput: %d [msg/s]\n",local_78._M_dataplus._M_p,
         ((long)(dVar6 - 9.223372036854776e+18) & (long)uVar3 >> 0x3f | uVar3) & 0xffffffff);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  SenderFlow::name_abi_cxx11_(&local_78,this);
  flow_thread();
  fclose(__stream);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void *flow_thread(void *thread_args)
{
    int message_count = 0;
    unsigned long elapsed;
    unsigned long throughput;
    double megabits;

    // Get thread arguments
    struct flow_thread_args *args = (struct flow_thread_args*)thread_args;
    SenderFlow *sf = args->flow;
    std::string filename = args->filename;
    size_t buffsize = args->buffsize;

    FILE *file __attribute__((cleanup (__raii_file))) =
        fopen(filename.c_str(), "r");
    if (file == NULL) {
        char errmsg[32];
        sprintf(errmsg, "fopen(\"%s\")", filename.c_str());
        perror(errmsg);
        return NULL;
    }

    char *buffer = new char[buffsize];
    void *watch = zmq_stopwatch_start();

    while (!feof(file)) {
        size_t read = fread(buffer, 1, buffsize, file);
        sf->send(buffer, read);
        message_count++;
    }
    delete[] buffer;

    elapsed = zmq_stopwatch_stop (watch);
    if (elapsed == 0)
        elapsed = 1;

    size_t message_size = buffsize;
    throughput = (unsigned long) ((double) message_count / (double) elapsed * 1000000);
    megabits = (double) (throughput * message_size * 8) / 1000000;

    printf ("%s. message size: %d [B]\n", sf->name().c_str(), (int) message_size);
    printf ("%s. message count: %d\n", sf->name().c_str(), (int) message_count);
    printf ("%s. mean throughput: %d [msg/s]\n", sf->name().c_str(), (int) throughput);
    printf ("%s. mean throughput: %.3f [Mb/s]\n", sf->name().c_str(), (double) megabits);
}